

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fusion.c
# Opt level: O2

void test_gfmul(void)

{
  ptls_fusion_aesgcm_ghash_precompute256 *precompute;
  ptls_fusion_aesgcm_ghash_precompute256 *precompute_00;
  uint8_t uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  __m256i X;
  __m256i X_00;
  __m256i X_01;
  __m256i X_02;
  __m256i X_03;
  __m256i X_04;
  __m256i X_05;
  __m256i X_06;
  __m256i X_07;
  __m256i X_08;
  int iVar7;
  size_t sVar8;
  ptls_fusion_aesgcm_context_t *ctx;
  ptls_fusion_aesgcm_ghash_precompute128 *in_RCX;
  ptls_fusion_aesgcm_ghash_precompute128 *ppVar9;
  longlong extraout_RDX;
  longlong lVar10;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  longlong extraout_RDX_06;
  size_t sVar11;
  ptls_fusion_aesgcm_ghash_precompute128 *precompute_01;
  longlong lVar12;
  longlong lVar13;
  __m128i X_09;
  __m128i X_10;
  __m128i X_11;
  __m128i X_12;
  __m128i X_13;
  __m128i X_14;
  __m128i X_15;
  ptls_fusion_gfmul_state256 state;
  size_t ghash_cnt;
  longlong in_stack_ffffffffffffff40;
  longlong in_stack_ffffffffffffff48;
  longlong in_stack_ffffffffffffff50;
  longlong in_stack_ffffffffffffff58;
  size_t local_60 [6];
  
  iVar7 = ptls_fusion_can_aesni256;
  local_60[0] = 4;
  sVar8 = calc_aesgcm_context_size(local_60,ptls_fusion_can_aesni256);
  ctx = (ptls_fusion_aesgcm_context_t *)malloc(sVar8);
  sVar8 = local_60[0];
  sVar11 = local_60[0] << 4;
  memset(ctx,0,0x1e4);
  (ctx->ecb).aesni256 = (uint8_t)iVar7;
  *(undefined8 *)&(ctx->ecb).field_0x1e5 = 0;
  *(undefined8 *)&(ctx->ecb).field_0x1ed = 0;
  *(undefined8 *)&(ctx->ecb).field_0x1f0 = 0;
  *(undefined8 *)&(ctx->ecb).field_0x1f8 = 0;
  ctx->capacity = sVar11;
  ctx->ghash_cnt = 0;
  *(undefined8 *)&ctx->field_0x210 = 0;
  *(undefined8 *)&ctx->field_0x218 = 0;
  if ((uint8_t)iVar7 == '\0') {
    ctx[1].ecb.keys.m128[0][0] = 0x6f77206f6c6c6568;
    ctx[1].ecb.keys.m128[0][1] = 0x65796220646c72;
  }
  else {
    ctx[1].ecb.keys.m128[1][0] = 0x6f77206f6c6c6568;
    ctx[1].ecb.keys.m128[1][1] = 0x65796220646c72;
  }
  lVar10 = extraout_RDX;
  while (ctx->ghash_cnt < sVar8) {
    setup_one_ghash_entry(ctx);
    lVar10 = extraout_RDX_00;
  }
  uVar1 = (ctx->ecb).aesni256;
  precompute = (ptls_fusion_aesgcm_ghash_precompute256 *)(ctx + 1);
  if (uVar1 == '\0') {
    lVar12 = 0;
    lVar13 = 0;
    X_09[1] = lVar10;
    X_09[0] = (longlong)precompute;
    gfmul_firststep128((ptls_fusion_gfmul_state128 *)&stack0xffffffffffffff40,X_09,in_RCX);
    gfmul_reduce128((ptls_fusion_gfmul_state128 *)&stack0xffffffffffffff40);
    in_stack_ffffffffffffff50 = lVar12;
    in_stack_ffffffffffffff58 = lVar13;
  }
  else {
    X[1] = in_stack_ffffffffffffff48;
    X[0] = in_stack_ffffffffffffff40;
    X[2] = in_stack_ffffffffffffff50;
    X[3] = in_stack_ffffffffffffff58;
    gfmul_firststep256((ptls_fusion_gfmul_state256 *)&stack0xffffffffffffff40,X,1,precompute);
    gfmul_reduce256((ptls_fusion_gfmul_state256 *)&stack0xffffffffffffff40);
    lVar12 = 0;
    lVar13 = 0;
  }
  auVar2._8_8_ = lVar13;
  auVar2._0_8_ = lVar12;
  ppVar9 = (ptls_fusion_aesgcm_ghash_precompute128 *)0x7f;
  _ok((uint)(auVar2 == _DAT_001237a0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/fusion.c");
  if (uVar1 == '\0') {
    lVar10 = 0;
    lVar12 = 0;
    X_10[1] = extraout_RDX_01;
    X_10[0] = (longlong)((long)&ctx[1].ecb.keys + 0x20);
    gfmul_firststep128((ptls_fusion_gfmul_state128 *)&stack0xffffffffffffff40,X_10,ppVar9);
    gfmul_nextstep128((ptls_fusion_gfmul_state128 *)&stack0xffffffffffffff40,
                      (__m128i)s__Lorem_ipsum_dolor_sit_amet__con_001237af._17_16_,
                      (ptls_fusion_aesgcm_ghash_precompute128 *)&precompute->field_0);
    gfmul_reduce128((ptls_fusion_gfmul_state128 *)&stack0xffffffffffffff40);
    in_stack_ffffffffffffff50 = lVar10;
    in_stack_ffffffffffffff58 = lVar12;
  }
  else {
    X_00[1] = lVar13;
    X_00[0] = lVar12;
    X_00[2] = in_stack_ffffffffffffff50;
    X_00[3] = in_stack_ffffffffffffff58;
    gfmul_firststep256((ptls_fusion_gfmul_state256 *)&stack0xffffffffffffff40,X_00,0,precompute);
    gfmul_reduce256((ptls_fusion_gfmul_state256 *)&stack0xffffffffffffff40);
    lVar10 = 0;
    lVar12 = 0;
  }
  auVar3._8_8_ = lVar12;
  auVar3._0_8_ = lVar10;
  ppVar9 = (ptls_fusion_aesgcm_ghash_precompute128 *)0x93;
  _ok((uint)(auVar3 == _DAT_001237d0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/fusion.c");
  precompute_00 = (ptls_fusion_aesgcm_ghash_precompute256 *)((long)&ctx[1].ecb.keys + 0x40);
  if (uVar1 == '\0') {
    lVar10 = 0;
    lVar12 = 0;
    X_11[1] = extraout_RDX_02;
    X_11[0] = (longlong)precompute_00;
    gfmul_firststep128((ptls_fusion_gfmul_state128 *)&stack0xffffffffffffff40,X_11,ppVar9);
    gfmul_nextstep128((ptls_fusion_gfmul_state128 *)&stack0xffffffffffffff40,
                      (__m128i)s_UThe_quick_brown_fox_jumps_over_t_001237df._17_16_,
                      (ptls_fusion_aesgcm_ghash_precompute128 *)(ctx[1].ecb.keys.m256 + 1));
    gfmul_nextstep128((ptls_fusion_gfmul_state128 *)&stack0xffffffffffffff40,
                      (__m128i)s_UThe_quick_brown_fox_jumps_over_t_001237df._33_16_,
                      (ptls_fusion_aesgcm_ghash_precompute128 *)&precompute->field_0);
    gfmul_reduce128((ptls_fusion_gfmul_state128 *)&stack0xffffffffffffff40);
    in_stack_ffffffffffffff50 = lVar10;
    in_stack_ffffffffffffff58 = lVar12;
  }
  else {
    X_01[1] = lVar12;
    X_01[0] = lVar10;
    X_01[2] = in_stack_ffffffffffffff50;
    X_01[3] = in_stack_ffffffffffffff58;
    gfmul_firststep256((ptls_fusion_gfmul_state256 *)&stack0xffffffffffffff40,X_01,1,precompute_00);
    X_02[1] = lVar12;
    X_02[0] = lVar10;
    X_02[2] = in_stack_ffffffffffffff50;
    X_02[3] = in_stack_ffffffffffffff58;
    gfmul_nextstep256((ptls_fusion_gfmul_state256 *)&stack0xffffffffffffff40,X_02,precompute);
    gfmul_reduce256((ptls_fusion_gfmul_state256 *)&stack0xffffffffffffff40);
    lVar10 = 0;
    lVar12 = 0;
  }
  auVar4._8_8_ = lVar12;
  auVar4._0_8_ = lVar10;
  ppVar9 = (ptls_fusion_aesgcm_ghash_precompute128 *)0xa9;
  _ok((uint)(auVar4 == _DAT_00123810),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/fusion.c");
  if (uVar1 == '\0') {
    lVar10 = 0;
    lVar12 = 0;
    X_12[1] = extraout_RDX_03;
    X_12[0] = (longlong)((long)&ctx[1].ecb.keys + 0x60);
    gfmul_firststep128((ptls_fusion_gfmul_state128 *)&stack0xffffffffffffff40,X_12,ppVar9);
    gfmul_nextstep128((ptls_fusion_gfmul_state128 *)&stack0xffffffffffffff40,
                      (__m128i)s_KVr_sit_amet__consectetur_adipis_0012381e._2_16_,
                      (ptls_fusion_aesgcm_ghash_precompute128 *)&precompute_00->field_0);
    gfmul_nextstep128((ptls_fusion_gfmul_state128 *)&stack0xffffffffffffff40,
                      (__m128i)s_KVr_sit_amet__consectetur_adipis_0012381e._18_16_,
                      (ptls_fusion_aesgcm_ghash_precompute128 *)(ctx[1].ecb.keys.m256 + 1));
    gfmul_nextstep128((ptls_fusion_gfmul_state128 *)&stack0xffffffffffffff40,
                      (__m128i)s_KVr_sit_amet__consectetur_adipis_0012381e._34_16_,
                      (ptls_fusion_aesgcm_ghash_precompute128 *)&precompute->field_0);
    gfmul_reduce128((ptls_fusion_gfmul_state128 *)&stack0xffffffffffffff40);
    X_13[1] = extraout_RDX_04;
    X_13[0] = (longlong)precompute;
    gfmul_firststep128((ptls_fusion_gfmul_state128 *)&stack0xffffffffffffff40,X_13,ppVar9);
    gfmul_reduce128((ptls_fusion_gfmul_state128 *)&stack0xffffffffffffff40);
    in_stack_ffffffffffffff50 = lVar10;
    in_stack_ffffffffffffff58 = lVar12;
  }
  else {
    X_03[1] = lVar12;
    X_03[0] = lVar10;
    X_03[2] = in_stack_ffffffffffffff50;
    X_03[3] = in_stack_ffffffffffffff58;
    gfmul_firststep256((ptls_fusion_gfmul_state256 *)&stack0xffffffffffffff40,X_03,0,precompute_00);
    X_04[1] = lVar12;
    X_04[0] = lVar10;
    X_04[2] = in_stack_ffffffffffffff50;
    X_04[3] = in_stack_ffffffffffffff58;
    gfmul_nextstep256((ptls_fusion_gfmul_state256 *)&stack0xffffffffffffff40,X_04,precompute);
    gfmul_reduce256((ptls_fusion_gfmul_state256 *)&stack0xffffffffffffff40);
    X_05[1] = lVar12;
    X_05[0] = lVar10;
    X_05[2] = in_stack_ffffffffffffff50;
    X_05[3] = in_stack_ffffffffffffff58;
    gfmul_firststep256((ptls_fusion_gfmul_state256 *)&stack0xffffffffffffff40,X_05,1,precompute);
    gfmul_reduce256((ptls_fusion_gfmul_state256 *)&stack0xffffffffffffff40);
    lVar10 = 0;
    lVar12 = 0;
  }
  auVar5._8_8_ = lVar12;
  auVar5._0_8_ = lVar10;
  ppVar9 = (ptls_fusion_aesgcm_ghash_precompute128 *)0xc5;
  _ok((uint)(auVar5 == _DAT_00123860),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/fusion.c");
  if (uVar1 == '\0') {
    lVar10 = 0;
    lVar12 = 0;
    X_14[1] = extraout_RDX_05;
    X_14[0] = (longlong)((long)&ctx[1].ecb.keys + 0x60);
    gfmul_firststep128((ptls_fusion_gfmul_state128 *)&stack0xffffffffffffff40,X_14,ppVar9);
    gfmul_nextstep128((ptls_fusion_gfmul_state128 *)&stack0xffffffffffffff40,
                      (__m128i)s_KVr_sit_amet__consectetur_adipis_0012381e._2_16_,
                      (ptls_fusion_aesgcm_ghash_precompute128 *)&precompute_00->field_0);
    precompute_01 = (ptls_fusion_aesgcm_ghash_precompute128 *)(ctx[1].ecb.keys.m256 + 1);
    gfmul_nextstep128((ptls_fusion_gfmul_state128 *)&stack0xffffffffffffff40,
                      (__m128i)s_KVr_sit_amet__consectetur_adipis_0012381e._18_16_,precompute_01);
    gfmul_nextstep128((ptls_fusion_gfmul_state128 *)&stack0xffffffffffffff40,
                      (__m128i)s_KVr_sit_amet__consectetur_adipis_0012381e._34_16_,
                      (ptls_fusion_aesgcm_ghash_precompute128 *)&precompute->field_0);
    gfmul_reduce128((ptls_fusion_gfmul_state128 *)&stack0xffffffffffffff40);
    X_15[1] = extraout_RDX_06;
    X_15[0] = (longlong)precompute_01;
    gfmul_firststep128((ptls_fusion_gfmul_state128 *)&stack0xffffffffffffff40,X_15,ppVar9);
    gfmul_nextstep128((ptls_fusion_gfmul_state128 *)&stack0xffffffffffffff40,
                      (__m128i)s__eiusmod_tempor_incididunt_ut_la_0012386f._17_16_,
                      (ptls_fusion_aesgcm_ghash_precompute128 *)&precompute->field_0);
    gfmul_reduce128((ptls_fusion_gfmul_state128 *)&stack0xffffffffffffff40);
  }
  else {
    X_06[1] = lVar12;
    X_06[0] = lVar10;
    X_06[2] = in_stack_ffffffffffffff50;
    X_06[3] = in_stack_ffffffffffffff58;
    gfmul_firststep256((ptls_fusion_gfmul_state256 *)&stack0xffffffffffffff40,X_06,0,precompute_00);
    X_07[1] = lVar12;
    X_07[0] = lVar10;
    X_07[2] = in_stack_ffffffffffffff50;
    X_07[3] = in_stack_ffffffffffffff58;
    gfmul_nextstep256((ptls_fusion_gfmul_state256 *)&stack0xffffffffffffff40,X_07,precompute);
    gfmul_reduce256((ptls_fusion_gfmul_state256 *)&stack0xffffffffffffff40);
    X_08[1] = lVar12;
    X_08[0] = lVar10;
    X_08[2] = in_stack_ffffffffffffff50;
    X_08[3] = in_stack_ffffffffffffff58;
    gfmul_firststep256((ptls_fusion_gfmul_state256 *)&stack0xffffffffffffff40,X_08,0,precompute);
    gfmul_reduce256((ptls_fusion_gfmul_state256 *)&stack0xffffffffffffff40);
    lVar10 = 0;
    lVar12 = 0;
  }
  auVar6._8_8_ = lVar12;
  auVar6._0_8_ = lVar10;
  _ok((uint)(auVar6 == _DAT_00123890),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/fusion.c",0xe2);
  free(ctx);
  return;
}

Assistant:

static void test_gfmul(void)
{
    ptls_fusion_aesgcm_context_t *ctx;
    size_t ghash_cnt = 4;

    ctx = malloc(calc_aesgcm_context_size(&ghash_cnt, ptls_fusion_can_aesni256));
    *ctx = (ptls_fusion_aesgcm_context_t){
        .ecb = {.aesni256 = ptls_fusion_can_aesni256},
        .capacity = ghash_cnt * 16,
    };

    __m128i H0 = _mm_loadu_si128((void *)"hello world bye");
    if (ctx->ecb.aesni256) {
        ((struct ptls_fusion_aesgcm_context256 *)ctx)->ghash[0].H[1] = H0;
    } else {
        ((struct ptls_fusion_aesgcm_context128 *)ctx)->ghash[0].H = H0;
    }

    while (ctx->ghash_cnt < ghash_cnt)
        setup_one_ghash_entry(ctx);

#define GHASH128 (((struct ptls_fusion_aesgcm_context128 *)ctx)->ghash)
#define GHASH256 (((struct ptls_fusion_aesgcm_context256 *)ctx)->ghash)

    {                                                     /* one block */
        static const char input[32] = "deaddeadbeefbeef"; /* latter 16-bytes are NUL */
        __m128i hash;
        if (ctx->ecb.aesni256) {
            struct ptls_fusion_gfmul_state256 state;
            state.lo = _mm256_setzero_si256();
            gfmul_firststep256(&state, _mm256_loadu_si256((void *)input), 1, GHASH256);
            gfmul_reduce256(&state);
            hash = _mm256_castsi256_si128(state.lo);
        } else {
            struct ptls_fusion_gfmul_state128 state;
            state.lo = _mm_setzero_si128();
            gfmul_firststep128(&state, _mm_loadu_si128((void *)input), GHASH128);
            gfmul_reduce128(&state);
            hash = state.lo;
        }
        ok(memcmp(&hash, "\x12\xd9\xd9\x14\x8b\x3f\x20\xbd\x20\x2a\xa5\x9e\x17\xa8\xb0\x7b", 16) == 0);
    }

    { /* two blocks */
        static const char input[32] = "Lorem ipsum dolor sit amet, con";
        __m128i hash;
        if (ctx->ecb.aesni256) {
            struct ptls_fusion_gfmul_state256 state;
            state.lo = _mm256_setzero_si256();
            gfmul_firststep256(&state, _mm256_loadu_si256((void *)input), 0, GHASH256);
            gfmul_reduce256(&state);
            hash = _mm256_castsi256_si128(state.lo);
        } else {
            struct ptls_fusion_gfmul_state128 state;
            state.lo = _mm_setzero_si128();
            gfmul_firststep128(&state, _mm_loadu_si128((void *)input), GHASH128 + 1);
            gfmul_nextstep128(&state, _mm_loadu_si128((void *)(input + 16)), GHASH128);
            gfmul_reduce128(&state);
            hash = state.lo;
        }
        ok(memcmp(&hash, "\xda\xdf\xe8\x9b\xc7\x8c\xbd\x5c\xa7\xc1\x83\x9a\xa2\x9f\x80\x55", 16) == 0);
    }

    { /* three blocks */
        static const char input[64] = "The quick brown fox jumps over the lazy dog.";
        __m128i hash;
        if (ctx->ecb.aesni256) {
            struct ptls_fusion_gfmul_state256 state;
            state.lo = _mm256_setzero_si256();
            gfmul_firststep256(&state, _mm256_loadu_si256((void *)input), 1, GHASH256 + 1);
            gfmul_nextstep256(&state, _mm256_loadu_si256((void *)(input + 16)), GHASH256);
            gfmul_reduce256(&state);
            hash = _mm256_castsi256_si128(state.lo);
        } else {
            struct ptls_fusion_gfmul_state128 state;
            state.lo = _mm_setzero_si128();
            gfmul_firststep128(&state, _mm_loadu_si128((void *)input), GHASH128 + 2);
            gfmul_nextstep128(&state, _mm_loadu_si128((void *)(input + 16)), GHASH128 + 1);
            gfmul_nextstep128(&state, _mm_loadu_si128((void *)(input + 32)), GHASH128);
            gfmul_reduce128(&state);
            hash = state.lo;
        }
        ok(memcmp(&hash, "\xad\xdf\x91\x52\x38\x40\xf7\xc3\x85\xaf\x41\xb1\x7d\xed\x4b\x56", 16) == 0);
    }

    { /* five blocks */
        static const char input[96] =
            "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor "; /* last 16 bytes are NUL */
        __m128i hash;
        if (ctx->ecb.aesni256) {
            struct ptls_fusion_gfmul_state256 state;
            state.lo = _mm256_setzero_si256();
            gfmul_firststep256(&state, _mm256_loadu_si256((void *)input), 0, GHASH256 + 1);
            gfmul_nextstep256(&state, _mm256_loadu_si256((void *)(input + 32)), GHASH256);
            gfmul_reduce256(&state);
            gfmul_firststep256(&state, _mm256_loadu_si256((void *)(input + 64)), 1, GHASH256);
            gfmul_reduce256(&state);
            hash = _mm256_castsi256_si128(state.lo);
        } else {
            struct ptls_fusion_gfmul_state128 state;
            state.lo = _mm_setzero_si128();
            gfmul_firststep128(&state, _mm_loadu_si128((void *)input), GHASH128 + 3);
            gfmul_nextstep128(&state, _mm_loadu_si128((void *)(input + 16)), GHASH128 + 2);
            gfmul_nextstep128(&state, _mm_loadu_si128((void *)(input + 32)), GHASH128 + 1);
            gfmul_nextstep128(&state, _mm_loadu_si128((void *)(input + 48)), GHASH128);
            gfmul_reduce128(&state);
            gfmul_firststep128(&state, _mm_loadu_si128((void *)(input + 64)), GHASH128);
            gfmul_reduce128(&state);
            hash = state.lo;
        }
        ok(memcmp(&hash, "\xb8\xab\x1b\xa8\xf2\x92\xf3\x89\x44\x9d\x39\xf6\xb6\x37\xca\x5d", 16) == 0);
    }

    { /* six blocks */
        static const char input[96] =
            "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor incididunt ut la";
        __m128i hash;
        if (ctx->ecb.aesni256) {
            struct ptls_fusion_gfmul_state256 state;
            state.lo = _mm256_setzero_si256();
            gfmul_firststep256(&state, _mm256_loadu_si256((void *)input), 0, GHASH256 + 1);
            gfmul_nextstep256(&state, _mm256_loadu_si256((void *)(input + 32)), GHASH256);
            gfmul_reduce256(&state);
            gfmul_firststep256(&state, _mm256_loadu_si256((void *)(input + 64)), 0, GHASH256);
            gfmul_reduce256(&state);
            hash = _mm256_castsi256_si128(state.lo);
        } else {
            struct ptls_fusion_gfmul_state128 state;
            state.lo = _mm_setzero_si128();
            gfmul_firststep128(&state, _mm_loadu_si128((void *)input), GHASH128 + 3);
            gfmul_nextstep128(&state, _mm_loadu_si128((void *)(input + 16)), GHASH128 + 2);
            gfmul_nextstep128(&state, _mm_loadu_si128((void *)(input + 32)), GHASH128 + 1);
            gfmul_nextstep128(&state, _mm_loadu_si128((void *)(input + 48)), GHASH128);
            gfmul_reduce128(&state);
            gfmul_firststep128(&state, _mm_loadu_si128((void *)(input + 64)), GHASH128 + 1);
            gfmul_nextstep128(&state, _mm_loadu_si128((void *)(input + 80)), GHASH128);
            gfmul_reduce128(&state);
            hash = state.lo;
        }
        ok(memcmp(&hash, "\x52\xce\x25\x22\x86\x2c\x91\xa4\xe7\x4e\xf9\x9a\x32\x77\xbd\x3e", 16) == 0);
    }

    free(ctx);

#undef GHASH128
#undef GHASH256
}